

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msf_gif.h
# Opt level: O2

int msf_gif_begin(MsfGifState *handle,int width,int height)

{
  int16_t *piVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  MsfGifBuffer *pMVar4;
  undefined4 in_ECX;
  int iVar5;
  size_t __size;
  undefined1 auVar6 [16];
  
  (handle->currentFrame).depth = 0;
  (handle->currentFrame).count = 0;
  (handle->currentFrame).rbits = 0;
  (handle->currentFrame).gbits = 0;
  *(undefined8 *)&(handle->previousFrame).bbits = 0;
  (handle->currentFrame).pixels = (uint32_t *)0x0;
  (handle->previousFrame).depth = 0;
  (handle->previousFrame).count = 0;
  (handle->previousFrame).rbits = 0;
  (handle->previousFrame).gbits = 0;
  *(undefined8 *)&(handle->currentFrame).bbits = 0;
  handle->width = width;
  handle->height = height;
  handle->framesSubmitted = 0;
  piVar1 = (int16_t *)malloc(0x200000);
  handle->lzwMem = piVar1;
  __size = (long)(height * width) << 2;
  puVar2 = (uint32_t *)malloc(__size);
  (handle->previousFrame).pixels = puVar2;
  puVar3 = (uint32_t *)malloc(__size);
  (handle->currentFrame).pixels = puVar3;
  pMVar4 = (MsfGifBuffer *)malloc(0x30);
  handle->listHead = pMVar4;
  auVar6._0_4_ = -(uint)((int)((ulong)piVar1 >> 0x20) == 0 && (int)piVar1 == 0);
  auVar6._4_4_ = -(uint)((int)pMVar4 == 0 && (int)((ulong)pMVar4 >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)((ulong)puVar2 >> 0x20) == 0 && (int)puVar2 == 0);
  auVar6._12_4_ = -(uint)((int)puVar3 == 0 && (int)((ulong)puVar3 >> 0x20) == 0);
  iVar5 = movmskps(in_ECX,auVar6);
  if (iVar5 == 0) {
    handle->listTail = pMVar4;
    pMVar4->next = (MsfGifBuffer *)0x0;
    pMVar4->size = 0x20;
    *(ulong *)pMVar4->data = (ulong)(uint)width << 0x30 | 0x613938464947;
    *(short *)&pMVar4[1].next = (short)height;
    *(undefined8 *)((long)&pMVar4[1].next + 2) = 0x454e0bff21000070;
    *(undefined8 *)((long)&pMVar4[1].size + 2) = 0x2e32455041435354;
    *(undefined8 *)pMVar4[1].data = 0x103302e32;
  }
  else {
    msf_free_gif_state(handle);
  }
  return (uint)(iVar5 == 0);
}

Assistant:

int msf_gif_begin(MsfGifState * handle, int width, int height) { MsfTimeFunc
    //NOTE: we cannot stomp the entire struct to zero because we must preserve `customAllocatorContext`.
    MsfCookedFrame empty = {0}; //god I hate MSVC...
    handle->previousFrame = empty;
    handle->currentFrame = empty;
    handle->width = width;
    handle->height = height;
    handle->framesSubmitted = 0;

    //allocate memory for LZW buffer
    //NOTE: Unfortunately we can't just use stack memory for the LZW table because it's 2MB,
    //      which is more stack space than most operating systems give by default,
    //      and we can't realistically expect users to be willing to override that just to use our library,
    //      so we have to allocate this on the heap.
    handle->lzwMem = (int16_t *) MSF_GIF_MALLOC(handle->customAllocatorContext, lzwAllocSize);
    handle->previousFrame.pixels =
        (uint32_t *) MSF_GIF_MALLOC(handle->customAllocatorContext, handle->width * handle->height * sizeof(uint32_t));
    handle->currentFrame.pixels =
        (uint32_t *) MSF_GIF_MALLOC(handle->customAllocatorContext, handle->width * handle->height * sizeof(uint32_t));

    //setup header buffer header (lol)
    handle->listHead = (MsfGifBuffer *) MSF_GIF_MALLOC(handle->customAllocatorContext, offsetof(MsfGifBuffer, data) + 32);
    if (!handle->listHead || !handle->lzwMem || !handle->previousFrame.pixels || !handle->currentFrame.pixels) {
        msf_free_gif_state(handle);
        return 0;
    }
    handle->listTail = handle->listHead;
    handle->listHead->next = NULL;
    handle->listHead->size = 32;

    //NOTE: because __attribute__((__packed__)) is annoyingly compiler-specific, we do this unreadable weirdness
    char headerBytes[33] = "GIF89a\0\0\0\0\x70\0\0" "\x21\xFF\x0BNETSCAPE2.0\x03\x01\0\0\0";
    memcpy(&headerBytes[6], &width, 2);
    memcpy(&headerBytes[8], &height, 2);
    memcpy(handle->listHead->data, headerBytes, 32);
    return 1;
}